

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O2

bool am_active_if_need_object_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Slot_Key key;
  Am_Object local_20;
  
  key = (Am_Slot_Key)self;
  Am_Object::Get_Sibling(&local_20,key,(ulong)Am_CHANGE_LEFT);
  pAVar3 = Am_Object::Get(&local_20,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_20,key,(ulong)Am_LEFT_HOW);
    pAVar3 = Am_Object::Get(&local_20,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::~Am_Object(&local_20);
    if (iVar2 - 0xcU < 0x58) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_20,key,(ulong)Am_CHANGE_TOP);
  pAVar3 = Am_Object::Get(&local_20,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_20,key,(ulong)Am_TOP_HOW);
    pAVar3 = Am_Object::Get(&local_20,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::~Am_Object(&local_20);
    if (iVar2 - 0xcU < 0x58) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_20,key,(ulong)Am_CHANGE_WIDTH);
  pAVar3 = Am_Object::Get(&local_20,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_20,key,(ulong)Am_WIDTH_HOW);
    pAVar3 = Am_Object::Get(&local_20,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::~Am_Object(&local_20);
    if (iVar2 - 0xcU < 0x58) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_20,key,(ulong)Am_CHANGE_HEIGHT);
  pAVar3 = Am_Object::Get(&local_20,0x169,0);
  bVar1 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_20,key,(ulong)Am_HEIGHT_HOW);
    pAVar3 = Am_Object::Get(&local_20,0x169,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::~Am_Object(&local_20);
    if (iVar2 - 0xcU < 0x58) {
      return true;
    }
  }
  return false;
}

Assistant:

Am_Define_Formula(bool, am_active_if_need_object)
{
  int val;
  if (self.Get_Sibling(Am_CHANGE_LEFT).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_LEFT_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_TOP).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_TOP_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_WIDTH).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_WIDTH_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_HEIGHT).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_HEIGHT_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  return false;
}